

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char cVar12;
  uint local_6c;
  
  pbVar8 = pData + height * stride;
  iVar10 = 0;
  local_6c = 0;
  uVar9 = 0;
  pbVar6 = pData;
  do {
    if (height <= local_6c) goto LAB_0010cf5a;
    iVar2 = getc((FILE *)IN);
    cVar12 = '\x01';
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        uVar3 = getc((FILE *)IN);
        switch(uVar3) {
        case 0:
          local_6c = local_6c + 1;
          pbVar6 = pData + local_6c * stride;
          cVar12 = '\0';
          uVar9 = 0;
          break;
        case 1:
          cVar12 = '\x03';
          break;
        case 2:
          iVar2 = getc((FILE *)IN);
          if (iVar2 != -1) {
            uVar9 = uVar9 + iVar2;
            iVar2 = getc((FILE *)IN);
            if (iVar2 != -1) {
              local_6c = local_6c + iVar2;
              pbVar6 = pData + (ulong)(local_6c * stride) + (ulong)uVar9;
              goto LAB_0010cf2d;
            }
          }
        case 0xffffffff:
switchD_0010cd6d_caseD_ffffffff:
          cVar12 = '\x01';
          break;
        default:
          if (((0 < (int)uVar3) && (uVar9 < width)) && (pbVar6 < pbVar8)) {
            lVar7 = 1;
            uVar11 = 0;
            iVar2 = 0;
            do {
              if (((uVar11 & 1) == 0) && (iVar2 = getc((FILE *)IN), iVar2 == -1)) {
                uVar9 = uVar9 + (int)uVar11;
                iVar10 = iVar10 + (int)uVar11;
                pbVar6 = pbVar6 + uVar11;
                goto switchD_0010cd6d_caseD_ffffffff;
              }
              bVar4 = (byte)iVar2 & 0xf;
              if ((uVar11 & 1) == 0) {
                bVar4 = (byte)iVar2 >> 4;
              }
              pbVar6[uVar11] = bVar4;
              uVar11 = uVar11 + 1;
            } while ((((int)lVar7 < (int)uVar3) && (uVar9 + (int)lVar7 < width)) &&
                    (pbVar1 = pbVar6 + lVar7, lVar7 = lVar7 + 1, pbVar1 < pbVar8));
            uVar9 = uVar9 + (int)uVar11;
            iVar10 = iVar10 + (int)uVar11;
            pbVar6 = pbVar6 + uVar11;
          }
          if ((uVar3 & 3) - 1 < 2) {
            iVar2 = getc((FILE *)IN);
            cVar12 = '\x01';
            if (iVar2 == -1) break;
          }
LAB_0010cf2d:
          cVar12 = '\0';
        }
      }
      else {
        uVar3 = getc((FILE *)IN);
        if ((((uVar3 != 0xffffffff) && (0 < iVar2)) && (uVar9 < width)) && (pbVar6 < pbVar8)) {
          iVar5 = 1;
          bVar4 = 0;
          do {
            *pbVar6 = (byte)(uVar3 >> (~bVar4 & 4)) & 0xf;
            iVar10 = iVar10 + 1;
            uVar9 = uVar9 + 1;
            pbVar6 = pbVar6 + 1;
            if ((iVar2 <= iVar5) || (width <= uVar9)) break;
            iVar5 = iVar5 + 1;
            bVar4 = bVar4 + 4;
          } while (pbVar6 < pbVar8);
        }
        cVar12 = uVar3 == 0xffffffff;
      }
    }
  } while (cVar12 == '\0');
  if (cVar12 == '\x03') {
LAB_0010cf5a:
    if (iVar10 == height * width) {
      return 1;
    }
    bmp_read_rle4_data_cold_1();
  }
  return 0;
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) { /* encoded mode */
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                written++;
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        int c1_int;
                        c1_int = getc(IN);
                        if (c1_int == EOF) {
                            return OPJ_FALSE;
                        }
                        c1 = (OPJ_UINT8)c1_int;
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                    written++;
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }  /* while(y < height) */
    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}